

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

void adapt::cuf::detail::WriteInt<int>(ostringstream *str,int *arg,char mod)

{
  exception *this;
  char mod_local;
  int *arg_local;
  ostringstream *str_local;
  
  if (mod == '\0') {
    Write<int,int>((ostream *)str,arg);
  }
  else if (mod == '?') {
    WriteAnyInt<int>((ostream *)str,*arg);
  }
  else if (mod == 'g') {
    Write<char,int>((ostream *)str,arg);
  }
  else if (mod == 'h') {
    Write<short,int>((ostream *)str,arg);
  }
  else if (mod == 'l') {
    Write<long,int>((ostream *)str,arg);
  }
  else {
    if (mod != 'm') {
      this = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(this);
      __cxa_throw(this,&std::exception::typeinfo,std::exception::~exception);
    }
    Write<long_long,int>((ostream *)str,arg);
  }
  return;
}

Assistant:

void WriteInt(std::ostringstream& str, const Value& arg, char mod)
{
	switch (mod)
	{
	case 0: Write<int>(str, arg); break;
	case 'l': Write<long>(str, arg); break;
	case 'm': Write<long long>(str, arg); break;
	case 'h': Write<short>(str, arg); break;
	case 'g': Write<char>(str, arg); break;
	case '?': WriteAnyInt(str, arg); break;
	default: throw std::exception(); break;
	}
}